

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall
RandomizerWorld::add_custom_dialogue(RandomizerWorld *this,Entity *entity,string *text)

{
  mapped_type *this_00;
  Entity *entity_local;
  GameText local_58;
  
  entity_local = entity;
  GameText::GameText(&local_58,text,'\x03');
  this_00 = std::
            map<Entity_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_custom_dialogues,&entity_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&local_58._output_text);
  GameText::~GameText(&local_58);
  return;
}

Assistant:

void RandomizerWorld::add_custom_dialogue(Entity* entity, const std::string& text)
{
    _custom_dialogues[entity] = GameText(text).get_output();
}